

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_htmlspecialchars(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  undefined8 in_RAX;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  char *zString;
  jx9_value *pjVar7;
  long lVar8;
  byte *pbVar9;
  byte *zString_00;
  int nLen;
  undefined8 local_38;
  
  local_38._4_4_ = (int)((ulong)in_RAX >> 0x20);
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    pbVar4 = (byte *)jx9_value_to_string(*apArg,(int *)((long)&local_38 + 4));
    iVar6 = local_38._4_4_;
    lVar8 = (long)local_38._4_4_;
    local_38 = CONCAT44(local_38._4_4_,0x41);
    if (nArg != 1) {
      pjVar7 = apArg[1];
      jx9MemObjToInteger(pjVar7);
      iVar2 = *(int *)&pjVar7->x;
      iVar5 = 0x41;
      if (-1 < iVar2) {
        iVar5 = iVar2;
      }
      local_38 = CONCAT44(local_38._4_4_,iVar5);
    }
    if (0 < iVar6) {
      pbVar9 = pbVar4 + lVar8;
      zString_00 = pbVar4;
LAB_0012f767:
      do {
        if (((ulong)*pbVar4 < 0x3f) && ((0x500000c400000000U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))
        {
          bVar3 = true;
        }
        else {
          pbVar4 = pbVar4 + 1;
          if (pbVar4 < pbVar9) goto LAB_0012f767;
          bVar3 = false;
        }
        if (zString_00 < pbVar4) {
          jx9_value_string(pCtx->pRet,(char *)zString_00,(int)pbVar4 - (int)zString_00);
        }
        if (!bVar3) {
          return 0;
        }
        bVar1 = *pbVar4;
        if (bVar1 < 0x27) {
          if (bVar1 == 0x22) {
            pjVar7 = pCtx->pRet;
            if ((local_38 & 4) == 0) {
              zString = "&quot;";
              goto LAB_0012f82c;
            }
            zString = "\"";
LAB_0012f83a:
            iVar6 = 1;
            goto LAB_0012f83f;
          }
          if (bVar1 == 0x26) {
            pjVar7 = pCtx->pRet;
            zString = "&amp;";
            iVar6 = 5;
            goto LAB_0012f83f;
          }
        }
        else {
          if (bVar1 == 0x27) {
            pjVar7 = pCtx->pRet;
            if ((local_38 & 2) == 0) {
              zString = "\'";
              goto LAB_0012f83a;
            }
            zString = "&#039;";
LAB_0012f82c:
            iVar6 = 6;
          }
          else {
            if (bVar1 == 0x3c) {
              pjVar7 = pCtx->pRet;
              zString = "&lt;";
            }
            else {
              if (bVar1 != 0x3e) goto LAB_0012f844;
              pjVar7 = pCtx->pRet;
              zString = "&gt;";
            }
            iVar6 = 4;
          }
LAB_0012f83f:
          jx9_value_string(pjVar7,zString,iVar6);
        }
LAB_0012f844:
        pbVar4 = pbVar4 + 1;
        zString_00 = pbVar4;
      } while (pbVar4 < pbVar9);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_htmlspecialchars(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zCur, *zIn, *zEnd;
	int iFlags = 0x01|0x40; /* ENT_COMPAT | ENT_HTML401 */
	int nLen, c;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	/* Extract the flags if available */
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
		if( iFlags < 0 ){
			iFlags = 0x01|0x40;
		}
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '&' && zIn[0] != '\'' && zIn[0] != '"' && zIn[0] != '<' && zIn[0] != '>' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Append the raw string verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		if( zIn >= zEnd ){
			break;
		}
		c = zIn[0];
		if( c == '&' ){
			/* Expand '&amp;' */
			jx9_result_string(pCtx, "&amp;", (int)sizeof("&amp;")-1);
		}else if( c == '<' ){
			/* Expand '&lt;' */
			jx9_result_string(pCtx, "&lt;", (int)sizeof("&lt;")-1);
		}else if( c == '>' ){
			/* Expand '&gt;' */
			jx9_result_string(pCtx, "&gt;", (int)sizeof("&gt;")-1);
		}else if( c == '\'' ){
			if( iFlags & 0x02 /*ENT_QUOTES*/ ){
				/* Expand '&#039;' */
				jx9_result_string(pCtx, "&#039;", (int)sizeof("&#039;")-1);
			}else{
				/* Leave the single quote untouched */
				jx9_result_string(pCtx, "'", (int)sizeof(char));
			}
		}else if( c == '"' ){
			if( (iFlags & 0x04) == 0 /*ENT_NOQUOTES*/ ){
				/* Expand '&quot;' */
				jx9_result_string(pCtx, "&quot;", (int)sizeof("&quot;")-1);
			}else{
				/* Leave the double quote untouched */
				jx9_result_string(pCtx, "\"", (int)sizeof(char));
			}
		}
		/* Ignore the unsafe HTML character */
		zIn++;
	}
	return JX9_OK;
}